

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O1

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  ItemVector *pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  bool bVar8;
  string config;
  string local_98;
  string local_78;
  pointer local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pIVar5 = cmComputeLinkInformation::GetItems(cli);
  local_50[0] = local_40;
  pcVar1 = (cli->Config)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (cli->Config)._M_string_length);
  pIVar7 = (pIVar5->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar6 = (pIVar5->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = pIVar7 != pIVar6;
  if (bVar8) {
    local_58 = pIVar6;
    do {
      if ((pIVar7->Target != (cmGeneratorTarget *)0x0) &&
         (TVar4 = cmGeneratorTarget::GetType(pIVar7->Target), TVar4 == STATIC_LIBRARY)) {
        pcVar2 = pIVar7->Target;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
        bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_98);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          pcVar2 = pIVar7->Target;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"CUDA_SEPARABLE_COMPILATION","");
          bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        pIVar6 = local_58;
        if (bVar3 != false) break;
      }
      pIVar7 = pIVar7 + 1;
      bVar8 = pIVar7 != pIVar6;
    } while (bVar8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return bVar8;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  for (auto const& item : items) {
    if (item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
      if ((!item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS")) &&
          item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION")) {
        // this dependency requires us to device link it
        return true;
      }
    }
  }
  return false;
}